

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-connect.c
# Opt level: O2

int run_test_udp_connect(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  sockaddr_in ext_addr;
  int addrlen;
  sockaddr_in tmp_addr;
  uv_udp_send_t req;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&lo_addr);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_udp_init(puVar2,&server);
    if (iVar1 == 0) {
      iVar1 = uv_udp_bind(&server,(sockaddr *)&lo_addr,0);
      if (iVar1 == 0) {
        iVar1 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
        if (iVar1 == 0) {
          puVar2 = uv_default_loop();
          iVar1 = uv_udp_init(puVar2,&client);
          if (iVar1 == 0) {
            buf = uv_buf_init("EXIT",4);
            req.data = (void *)0x0;
            iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&tmp_addr);
            ext_addr._0_8_ = SEXT48(iVar1);
            if (req.data != (void *)ext_addr._0_8_) {
              pcVar5 = "uv_ip4_addr(\"0.0.0.0\", 9123, &tmp_addr)";
              pcVar4 = "0";
              uVar3 = 0x80;
LAB_0016b707:
              fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
                      ,uVar3,pcVar4,"==",pcVar5,req.data,"==",ext_addr._0_8_);
              abort();
            }
            iVar1 = uv_udp_connect(&client,(sockaddr *)&tmp_addr);
            req.data = (void *)(long)iVar1;
            ext_addr.sin_family = 0;
            ext_addr.sin_port = 0;
            ext_addr.sin_addr.s_addr = 0;
            if (req.data != (void *)0x0) {
              pcVar5 = "0";
              pcVar4 = "r";
              uVar3 = 0x85;
              goto LAB_0016b707;
            }
            iVar1 = uv_udp_connect(&client,(sockaddr *)0x0);
            req.data = (void *)(long)iVar1;
            ext_addr.sin_family = 0;
            ext_addr.sin_port = 0;
            ext_addr.sin_addr.s_addr = 0;
            if (req.data != (void *)0x0) {
              pcVar5 = "0";
              pcVar4 = "r";
              uVar3 = 0x87;
              goto LAB_0016b707;
            }
            iVar1 = uv_ip4_addr("8.8.8.8",0x23a3,&ext_addr);
            if (iVar1 == 0) {
              iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&lo_addr);
              if (iVar1 == 0) {
                iVar1 = uv_udp_connect(&client,(sockaddr *)&lo_addr);
                if (iVar1 == 0) {
                  iVar1 = uv_udp_connect(&client,(sockaddr *)&ext_addr);
                  if (iVar1 == -0x6a) {
                    addrlen = 0x10;
                    iVar1 = uv_udp_getpeername(&client,(sockaddr *)&tmp_addr,&addrlen);
                    if (iVar1 == 0) {
                      iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)&lo_addr);
                      if (iVar1 == -0x6a) {
                        iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)0x0);
                        if (iVar1 == 4) {
                          iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)&ext_addr);
                          if (iVar1 == -0x6a) {
                            iVar1 = uv_udp_connect(&client,(sockaddr *)0x0);
                            if (iVar1 == 0) {
                              iVar1 = uv_udp_connect(&client,(sockaddr *)0x0);
                              if (iVar1 == -0x6b) {
                                addrlen = 0x10;
                                iVar1 = uv_udp_getpeername(&client,(sockaddr *)&tmp_addr,&addrlen);
                                if (iVar1 == -0x6b) {
                                  iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)&lo_addr);
                                  if (iVar1 == 4) {
                                    iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)0x0);
                                    if (iVar1 == -0x59) {
                                      iVar1 = uv_udp_connect(&client,(sockaddr *)&lo_addr);
                                      if (iVar1 == 0) {
                                        iVar1 = uv_udp_send(&req,&client,&buf,1,(sockaddr *)&lo_addr
                                                            ,cl_send_cb);
                                        if (iVar1 == -0x6a) {
                                          iVar1 = uv_udp_send(&req,&client,&buf,1,(sockaddr *)0x0,
                                                              cl_send_cb);
                                          if (iVar1 == 0) {
                                            puVar2 = uv_default_loop();
                                            uv_run(puVar2,UV_RUN_DEFAULT);
                                            if (close_cb_called == 2) {
                                              if (sv_recv_cb_called == 4) {
                                                if (cl_send_cb_called == 2) {
                                                  if (client.send_queue_size == 0) {
                                                    if (server.send_queue_size == 0) {
                                                      puVar2 = uv_default_loop();
                                                      uv_walk(puVar2,close_walk_cb,(void *)0x0);
                                                      uv_run(puVar2,UV_RUN_DEFAULT);
                                                      puVar2 = uv_default_loop();
                                                      iVar1 = uv_loop_close(puVar2);
                                                      if (iVar1 == 0) {
                                                        uv_library_shutdown();
                                                        return 0;
                                                      }
                                                      pcVar4 = 
                                                  "0 == uv_loop_close(uv_default_loop())";
                                                  uVar3 = 0xc3;
                                                  }
                                                  else {
                                                    pcVar4 = "server.send_queue_size == 0";
                                                    uVar3 = 0xc1;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "client.send_queue_size == 0";
                                                    uVar3 = 0xc0;
                                                  }
                                                }
                                                else {
                                                  pcVar4 = "cl_send_cb_called == 2";
                                                  uVar3 = 0xbe;
                                                }
                                              }
                                              else {
                                                pcVar4 = "sv_recv_cb_called == 4";
                                                uVar3 = 0xbd;
                                              }
                                            }
                                            else {
                                              pcVar4 = "close_cb_called == 2";
                                              uVar3 = 0xbc;
                                            }
                                          }
                                          else {
                                            pcVar4 = "r == 0";
                                            uVar3 = 0xb8;
                                          }
                                        }
                                        else {
                                          pcVar4 = "r == UV_EISCONN";
                                          uVar3 = 0xb6;
                                        }
                                      }
                                      else {
                                        pcVar4 = "r == 0";
                                        uVar3 = 0xaf;
                                      }
                                    }
                                    else {
                                      pcVar4 = "r == UV_EDESTADDRREQ";
                                      uVar3 = 0xab;
                                    }
                                  }
                                  else {
                                    pcVar4 = "r == 4";
                                    uVar3 = 0xa9;
                                  }
                                }
                                else {
                                  pcVar4 = "r == UV_ENOTCONN";
                                  uVar3 = 0xa5;
                                }
                              }
                              else {
                                pcVar4 = "r == UV_ENOTCONN";
                                uVar3 = 0xa1;
                              }
                            }
                            else {
                              pcVar4 = "r == 0";
                              uVar3 = 0x9f;
                            }
                          }
                          else {
                            pcVar4 = "r == UV_EISCONN";
                            uVar3 = 0x9c;
                          }
                        }
                        else {
                          pcVar4 = "r == 4";
                          uVar3 = 0x9a;
                        }
                      }
                      else {
                        pcVar4 = "r == UV_EISCONN";
                        uVar3 = 0x98;
                      }
                    }
                    else {
                      pcVar4 = "r == 0";
                      uVar3 = 0x94;
                    }
                  }
                  else {
                    pcVar4 = "r == UV_EISCONN";
                    uVar3 = 0x90;
                  }
                }
                else {
                  pcVar4 = "r == 0";
                  uVar3 = 0x8e;
                }
              }
              else {
                pcVar4 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &lo_addr)";
                uVar3 = 0x8b;
              }
            }
            else {
              pcVar4 = "0 == uv_ip4_addr(\"8.8.8.8\", TEST_PORT, &ext_addr)";
              uVar3 = 0x8a;
            }
            goto LAB_0016b661;
          }
          pcVar4 = "r == 0";
          uVar3 = 0x7b;
        }
        else {
          pcVar4 = "r == 0";
          uVar3 = 0x78;
        }
      }
      else {
        pcVar4 = "r == 0";
        uVar3 = 0x75;
      }
    }
    else {
      pcVar4 = "r == 0";
      uVar3 = 0x72;
    }
  }
  else {
    pcVar4 = "0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &lo_addr)";
    uVar3 = 0x6f;
  }
LAB_0016b661:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(udp_connect) {
#if defined(__PASE__)
  RETURN_SKIP(
      "IBMi PASE's UDP connection can not be disconnected with AF_UNSPEC.");
#endif
  uv_udp_send_t req;
  struct sockaddr_in ext_addr;
  struct sockaddr_in tmp_addr;
  int r;
  int addrlen;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &lo_addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_bind(&server, (const struct sockaddr*) &lo_addr, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&server, alloc_cb, sv_recv_cb);
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  buf = uv_buf_init("EXIT", 4);

  /* connect() to INADDR_ANY fails on Windows wih WSAEADDRNOTAVAIL */
  ASSERT_EQ(0, uv_ip4_addr("0.0.0.0", TEST_PORT, &tmp_addr));
  r = uv_udp_connect(&client, (const struct sockaddr*) &tmp_addr);
#ifdef _WIN32
  ASSERT_EQ(r, UV_EADDRNOTAVAIL);
#else
  ASSERT_EQ(r, 0);
  r = uv_udp_connect(&client, NULL);
  ASSERT_EQ(r, 0);
#endif

  ASSERT(0 == uv_ip4_addr("8.8.8.8", TEST_PORT, &ext_addr));
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &lo_addr));

  r = uv_udp_connect(&client, (const struct sockaddr*) &lo_addr);
  ASSERT(r == 0);
  r = uv_udp_connect(&client, (const struct sockaddr*) &ext_addr);
  ASSERT(r == UV_EISCONN);

  addrlen = sizeof(tmp_addr);
  r = uv_udp_getpeername(&client, (struct sockaddr*) &tmp_addr, &addrlen);
  ASSERT(r == 0);

  /* To send messages in connected UDP sockets addr must be NULL */
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &lo_addr);
  ASSERT(r == UV_EISCONN);
  r = uv_udp_try_send(&client, &buf, 1, NULL);
  ASSERT(r == 4);
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &ext_addr);
  ASSERT(r == UV_EISCONN);

  r = uv_udp_connect(&client, NULL);
  ASSERT(r == 0);
  r = uv_udp_connect(&client, NULL);
  ASSERT(r == UV_ENOTCONN);

  addrlen = sizeof(tmp_addr);
  r = uv_udp_getpeername(&client, (struct sockaddr*) &tmp_addr, &addrlen);
  ASSERT(r == UV_ENOTCONN);

  /* To send messages in disconnected UDP sockets addr must be set */
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &lo_addr);
  ASSERT(r == 4);
  r = uv_udp_try_send(&client, &buf, 1, NULL);
  ASSERT(r == UV_EDESTADDRREQ);


  r = uv_udp_connect(&client, (const struct sockaddr*) &lo_addr);
  ASSERT(r == 0);
  r = uv_udp_send(&req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &lo_addr,
                  cl_send_cb);
  ASSERT(r == UV_EISCONN);
  r = uv_udp_send(&req, &client, &buf, 1, NULL, cl_send_cb);
  ASSERT(r == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 2);
  ASSERT(sv_recv_cb_called == 4);
  ASSERT(cl_send_cb_called == 2);

  ASSERT(client.send_queue_size == 0);
  ASSERT(server.send_queue_size == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}